

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearForce.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearForce::IntLoadResidual_F
          (ChLinkMotorLinearForce *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  element_type *peVar18;
  ChBodyFrame *pCVar19;
  int iVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar21;
  double *pdVar22;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Index index;
  ulong uVar23;
  ulong uVar24;
  undefined4 in_register_00000034;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  Vector mbody_torque;
  Vector mbody_force;
  Vector m_abs_force;
  ChFrame<double> aframe1;
  ChFrame<double> aframe2;
  ChVector<double> local_198;
  double local_180 [3];
  ChVector<double> local_168;
  double local_148;
  ChVector<double> local_140;
  ChFrame<double> local_128;
  ChFrame<double> local_a0;
  
  peVar18 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.m_func.
            super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar25 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*peVar18->_vptr_ChFunction[4])(peVar18,CONCAT44(in_register_00000034,off));
  local_148 = dVar25;
  ChFrame<double>::operator>>
            (&local_128,
             &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&local_a0,
             &(this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar26 = ZEXT816(0) << 0x40;
  local_198.m_data[0] = 0.0;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_148;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar1 = vfmadd231sd_fma(auVar29,auVar35,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar26,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar32,auVar35,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar2 = vfmadd231sd_fma(auVar2,auVar26,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar36,auVar35,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar26,auVar6);
  local_140.m_data[0] = auVar1._0_8_;
  local_140.m_data[1] = auVar2._0_8_;
  local_140.m_data[2] = auVar3._0_8_;
  local_168.m_data[2] = 0.0;
  local_168.m_data[1] = 0.0;
  local_198.m_data[2] = 0.0;
  local_198.m_data[1] = 0.0;
  local_168.m_data[0] = local_198.m_data[0];
  iVar20 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var,iVar20) + 0x2c) == '\0') {
    ChBodyFrame::To_abs_forcetorque
              ((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2,&local_140,&local_128.coord.pos,false,&local_168,
               &local_198);
    iVar20 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
                 super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
               super_ChFrame<double>._vptr_ChFrame[0x10])();
    lVar21 = (long)*(int *)(CONCAT44(extraout_var_00,iVar20) + 0x30);
    if ((lVar21 < 0) ||
       ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
        lVar21)) goto LAB_005cbc0d;
    pdVar22 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar21;
    uVar23 = 3;
    if ((((ulong)pdVar22 & 7) == 0) &&
       (uVar24 = (ulong)(-((uint)((ulong)pdVar22 >> 3) & 0x1fffffff) & 7), uVar24 < 3)) {
      uVar23 = uVar24;
    }
    if (uVar23 != 0) {
      uVar24 = 0;
      do {
        pdVar22[uVar24] = pdVar22[uVar24] - c * local_168.m_data[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar23 != uVar24);
    }
    if (uVar23 < 3) {
      do {
        pdVar22[uVar23] = pdVar22[uVar23] - c * local_168.m_data[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar23 != 3);
    }
    pCVar19 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body2;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_198.m_data[0];
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         local_198.m_data[1] *
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar1 = vfmadd231sd_fma(auVar33,auVar27,auVar26);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_198.m_data[2];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar1 = vfmadd231sd_fma(auVar1,auVar37,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         local_198.m_data[1] *
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar2 = vfmadd231sd_fma(auVar39,auVar27,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar2 = vfmadd231sd_fma(auVar2,auVar37,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         local_198.m_data[1] *
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar3 = vfmadd231sd_fma(auVar30,auVar27,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar3 = vfmadd231sd_fma(auVar3,auVar37,auVar11);
    local_180[0] = auVar1._0_8_;
    local_180[1] = auVar2._0_8_;
    local_180[2] = auVar3._0_8_;
    iVar20 = (*(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    iVar20 = *(int *)(CONCAT44(extraout_var_01,iVar20) + 0x30);
    if ((iVar20 < -3) ||
       (lVar21 = (long)(iVar20 + 3),
       (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3 <
       lVar21)) goto LAB_005cbc0d;
    pdVar22 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar21;
    uVar23 = 3;
    if ((((ulong)pdVar22 & 7) == 0) &&
       (uVar24 = (ulong)(-((uint)((ulong)pdVar22 >> 3) & 0x1fffffff) & 7), uVar24 < 3)) {
      uVar23 = uVar24;
    }
    if (uVar23 != 0) {
      uVar24 = 0;
      do {
        pdVar22[uVar24] = pdVar22[uVar24] - c * local_180[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar23 != uVar24);
    }
    if (uVar23 < 3) {
      do {
        pdVar22[uVar23] = pdVar22[uVar23] - c * local_180[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar23 != 3);
    }
  }
  iVar20 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_02,iVar20) + 0x2c) != '\0') {
    return;
  }
  ChBodyFrame::To_abs_forcetorque
            ((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1,&local_140,&local_128.coord.pos,false,&local_168,
             &local_198);
  iVar20 = (*(((this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  lVar21 = (long)*(int *)(CONCAT44(extraout_var_03,iVar20) + 0x30);
  if ((-1 < lVar21) &&
     (lVar21 <= (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                + -3)) {
    pdVar22 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
              lVar21;
    uVar23 = 3;
    if ((((ulong)pdVar22 & 7) == 0) &&
       (uVar24 = (ulong)(-((uint)((ulong)pdVar22 >> 3) & 0x1fffffff) & 7), uVar24 < 3)) {
      uVar23 = uVar24;
    }
    if (uVar23 != 0) {
      uVar24 = 0;
      do {
        pdVar22[uVar24] = c * local_168.m_data[uVar24] + pdVar22[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar23 != uVar24);
    }
    if (uVar23 < 3) {
      do {
        pdVar22[uVar23] = c * local_168.m_data[uVar23] + pdVar22[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar23 != 3);
    }
    pCVar19 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body1;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_198.m_data[0];
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         local_198.m_data[1] *
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar1 = vfmadd231sd_fma(auVar34,auVar28,auVar12);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_198.m_data[2];
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar1 = vfmadd231sd_fma(auVar1,auVar38,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         local_198.m_data[1] *
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar2 = vfmadd231sd_fma(auVar40,auVar28,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar2 = vfmadd231sd_fma(auVar2,auVar38,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         local_198.m_data[1] *
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar3 = vfmadd231sd_fma(auVar31,auVar28,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar3 = vfmadd231sd_fma(auVar3,auVar38,auVar17);
    local_180[0] = auVar1._0_8_;
    local_180[1] = auVar2._0_8_;
    local_180[2] = auVar3._0_8_;
    iVar20 = (*(pCVar19->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
    iVar20 = *(int *)(CONCAT44(extraout_var_04,iVar20) + 0x30);
    if ((-4 < iVar20) &&
       (lVar21 = (long)(iVar20 + 3),
       lVar21 <= (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows + -3)) {
      pdVar22 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
                + lVar21;
      uVar23 = 3;
      if ((((ulong)pdVar22 & 7) == 0) &&
         (uVar24 = (ulong)(-((uint)((ulong)pdVar22 >> 3) & 0x1fffffff) & 7), uVar24 < 3)) {
        uVar23 = uVar24;
      }
      if (uVar23 != 0) {
        uVar24 = 0;
        do {
          pdVar22[uVar24] = c * local_180[uVar24] + pdVar22[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar23 != uVar24);
      }
      if (2 < uVar23) {
        return;
      }
      do {
        pdVar22[uVar23] = c * local_180[uVar23] + pdVar22[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar23 != 3);
      return;
    }
  }
LAB_005cbc0d:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLinkMotorLinearForce::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    // compute instant force
    double mF = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_force = aframe2.GetA() * ChVector<>(mF, 0, 0);
    Vector mbody_force;
    Vector mbody_torque;

    if (Body2->Variables().IsActive()) {
        Body2->To_abs_forcetorque(m_abs_force,
                                  aframe1.GetPos(),            // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        R.segment(Body2->Variables().GetOffset() + 0, 3) -= c * mbody_force.eigen();
        R.segment(Body2->Variables().GetOffset() + 3, 3) -=
            c * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();
    }

    if (Body1->Variables().IsActive()) {
        Body1->To_abs_forcetorque(m_abs_force,
                                  aframe1.GetPos(),            // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        R.segment(Body1->Variables().GetOffset() + 0, 3) += c * mbody_force.eigen();
        R.segment(Body1->Variables().GetOffset() + 3, 3) +=
            c * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
    }
}